

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmodelbuilder.h
# Opt level: O2

bool __thiscall
ObjectModelBuilder::buildMaybeReplicator(ObjectModelBuilder *this,value *value,Class *clazz)

{
  bool bVar1;
  object *object;
  ostream *poVar2;
  
  if (value->type_ == 5) {
    object = picojson::value::
             get<std::map<std::__cxx11::string,picojson::value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,picojson::value>>>>
                       (value);
    bVar1 = buildReplicator(this,object,clazz);
    return bVar1;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"error: \'replicator\' in class=");
  poVar2 = std::operator<<(poVar2,(string *)clazz);
  poVar2 = std::operator<<(poVar2," is no a JSON object");
  std::endl<char,std::char_traits<char>>(poVar2);
  return false;
}

Assistant:

bool ObjectModelBuilder::buildMaybeReplicator(const picojson::value &value, Class *clazz)
{
    if (!value.is<picojson::object>()) {
        std::cerr << "error: 'replicator' in class=" << clazz->name << " is no a JSON object" << std::endl;
        return false;
    }

    return buildReplicator(value.get<picojson::object>(), clazz);
}